

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendImageCopy
          (ze_command_list_handle_t hCommandList,ze_image_handle_t hDstImage,
          ze_image_handle_t hSrcImage,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  ze_pfnCommandListAppendImageCopy_t pfnAppendImageCopy;
  ze_result_t result;
  ze_event_handle_t *phWaitEvents_local;
  uint32_t numWaitEvents_local;
  ze_event_handle_t hSignalEvent_local;
  ze_image_handle_t hSrcImage_local;
  ze_image_handle_t hDstImage_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendImageCopy._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c3a8 != (code *)0x0) {
    pfnAppendImageCopy._4_4_ =
         (*DAT_0011c3a8)(hCommandList,hDstImage,hSrcImage,hSignalEvent,numWaitEvents,phWaitEvents);
  }
  return pfnAppendImageCopy._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendImageCopy(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        ze_image_handle_t hDstImage,                    ///< [in] handle of destination image to copy to
        ze_image_handle_t hSrcImage,                    ///< [in] handle of source image to copy from
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendImageCopy = context.zeDdiTable.CommandList.pfnAppendImageCopy;
        if( nullptr != pfnAppendImageCopy )
        {
            result = pfnAppendImageCopy( hCommandList, hDstImage, hSrcImage, hSignalEvent, numWaitEvents, phWaitEvents );
        }
        else
        {
            // generic implementation
        }

        return result;
    }